

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O0

void __thiscall
CCIT<UFPC>::PerformLabelingMem
          (CCIT<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  int *piVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2e0;
  allocator<unsigned_long> local_279;
  value_type_conflict2 local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  uint local_258;
  int local_254;
  int iLabel;
  int c;
  int r;
  int x_1;
  int y_1;
  int x;
  int y;
  uint uStack_234;
  bool nextprocedure2;
  int k;
  int v;
  int u;
  int lx;
  int h;
  int w;
  undefined1 local_218 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_140;
  undefined1 local_e0 [8];
  MemMat<unsigned_char> img;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  CCIT<UFPC> *this_local;
  
  img.accesses_._88_8_ = accesses;
  cv::Mat_<unsigned_char>::Mat_(&local_140,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e0,&local_140);
  cv::Mat_<unsigned_char>::~Mat_(&local_140);
  cv::MatSize::operator()((MatSize *)&h);
  MemMat<int>::MemMat((MemMat<int> *)local_218,(Size *)&h,0);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  UFPC::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                 + 1);
  UFPC::MemSetup();
  lx = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  u = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  y_1 = 0;
  for (x_1 = 0; x_1 < lx; x_1 = x_1 + 2) {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,y_1,x_1);
    if (*puVar5 == '\0') {
      if ((x_1 + 1 < lx) &&
         (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,y_1,x_1 + 1),
         *puVar5 != '\0')) {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
        *puVar6 = uVar4;
        x._3_1_ = '\x01';
        v = uVar4;
      }
      else if ((y_1 + 1 < u) &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1), *puVar5 != '\0'))
      {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
        *puVar6 = uVar4;
        v = uVar4;
        if (((x_1 + 1 < lx) && (y_1 + 1 < u)) &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1), *puVar5 != '\0')
           ) {
          x._3_1_ = '\x01';
        }
        else {
          x._3_1_ = '\0';
        }
      }
      else if (((x_1 + 1 < lx) && (y_1 + 1 < u)) &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1),
              *puVar5 != '\0')) {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
        *puVar6 = uVar4;
        x._3_1_ = '\x01';
        v = uVar4;
      }
      else {
        x._3_1_ = '\0';
      }
    }
    else {
      uVar4 = UFPC::MemNewLabel();
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
      *puVar6 = uVar4;
      v = uVar4;
      if (((x_1 + 1 < lx) &&
          (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,y_1,x_1 + 1)
          , *puVar5 != '\0')) ||
         ((x_1 + 1 < lx &&
          ((y_1 + 1 < u &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1), *puVar5 != '\0')
           ))))) {
        x._3_1_ = '\x01';
      }
      else {
        x._3_1_ = '\0';
      }
    }
    while (x._3_1_ != '\0' && x_1 + 2 < lx) {
      x_1 = x_1 + 2;
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,y_1,x_1);
      iVar1 = v;
      if (*puVar5 == '\0') {
        if ((x_1 + 1 < lx) &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,y_1,x_1 + 1), *puVar5 != '\0')) {
          if ((y_1 + 1 < u) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1), iVar1 = v,
             *puVar5 != '\0')) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
            *piVar7 = iVar1;
          }
          else {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
            *puVar6 = uVar4;
            v = uVar4;
          }
          x._3_1_ = '\x01';
        }
        else if ((y_1 + 1 < u) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1), iVar1 = v,
                *puVar5 != '\0')) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
          *piVar7 = iVar1;
          if (((x_1 + 1 < lx) && (y_1 + 1 < u)) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1),
             *puVar5 != '\0')) {
            x._3_1_ = '\x01';
          }
          else {
            x._3_1_ = '\0';
          }
        }
        else if (((x_1 + 1 < lx) && (y_1 + 1 < u)) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1),
                *puVar5 != '\0')) {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
          *puVar6 = uVar4;
          x._3_1_ = '\x01';
          v = uVar4;
        }
        else {
          x._3_1_ = '\0';
        }
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,y_1,x_1);
        *piVar7 = iVar1;
        if (((x_1 + 1 < lx) &&
            (puVar5 = MemMat<unsigned_char>::operator()
                                ((MemMat<unsigned_char> *)local_e0,y_1,x_1 + 1), *puVar5 != '\0'))
           || ((x_1 + 1 < lx &&
               ((y_1 + 1 < u &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,y_1 + 1,x_1 + 1),
                *puVar5 != '\0')))))) {
          x._3_1_ = '\x01';
        }
        else {
          x._3_1_ = '\0';
        }
      }
    }
  }
  for (r = 2; r < u; r = r + 2) {
    for (c = 0; c < lx; c = c + 2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c);
      if (*puVar5 == '\0') {
        if ((c + 1 < lx) &&
           (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c + 1),
           *puVar5 != '\0')) {
          if ((c + 1 < lx) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1), *puVar5 != '\0'))
          {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            v = iVar1;
          }
          else {
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c);
            if (*puVar5 == '\0') {
              if ((c + 2 < lx) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                 *puVar5 != '\0')) {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
                *piVar7 = iVar1;
                v = iVar1;
              }
              else {
                uVar4 = UFPC::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
                *puVar6 = uVar4;
                v = uVar4;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *piVar7 = iVar1;
              v = iVar1;
              if ((c + 2 < lx) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                 *puVar5 != '\0')) {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                uStack_234 = *puVar6;
                UFPC::MemMerge(k,uStack_234);
              }
            }
          }
          x._3_1_ = '\x01';
        }
        else if ((r + 1 < u) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,r + 1,c), *puVar5 != '\0')) {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
          *puVar6 = uVar4;
          v = uVar4;
          if (((c + 1 < lx) && (r + 1 < u)) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1), *puVar5 != '\0'))
          {
            x._3_1_ = '\x01';
          }
          else {
            x._3_1_ = '\0';
          }
        }
        else if (((c + 1 < lx) && (r + 1 < u)) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1), *puVar5 != '\0'
                )) {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
          *puVar6 = uVar4;
          x._3_1_ = '\x01';
          v = uVar4;
        }
        else {
          x._3_1_ = '\0';
        }
      }
      else if ((c + 1 < lx) &&
              (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c + 1)
              , *puVar5 != '\0')) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c);
        if (*puVar5 == '\0') {
          if ((c + 1 < lx) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1), *puVar5 != '\0'))
          {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            v = iVar1;
            if ((0 < c + -1) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1),
               *puVar5 != '\0')) {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
          }
          else if ((c + -1 < 1) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1),
                  *puVar5 == '\0')) {
            if ((c + 2 < lx) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2), *puVar5 != '\0'
               )) {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *piVar7 = iVar1;
              v = iVar1;
            }
            else {
              uVar4 = UFPC::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *puVar6 = uVar4;
              v = uVar4;
            }
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            v = iVar1;
            if ((c + 2 < lx) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2), *puVar5 != '\0'
               )) {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
          }
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
          *piVar7 = iVar1;
          v = iVar1;
          if ((((lx <= c + 1) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1), *puVar5 == '\0'
               )) && (c + 2 < lx)) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2), *puVar5 != '\0'))
          {
            k = v;
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
            uStack_234 = *puVar6;
            UFPC::MemMerge(k,uStack_234);
          }
        }
        x._3_1_ = '\x01';
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c);
        if (*puVar5 == '\0') {
          if ((c + -1 < 1) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1), *puVar5 == '\0')
             ) {
            if ((c + 1 < lx) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1), *puVar5 != '\0'
               )) {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *piVar7 = iVar1;
              v = iVar1;
            }
            else {
              uVar4 = UFPC::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *puVar6 = uVar4;
              v = uVar4;
            }
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            v = iVar1;
            if ((c + 1 < lx) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1), *puVar5 != '\0'
               )) {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
          }
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
          *piVar7 = iVar1;
          v = iVar1;
        }
        if (((c + 1 < lx) && (r + 1 < u)) &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1), *puVar5 != '\0')) {
          x._3_1_ = '\x01';
        }
        else {
          x._3_1_ = '\0';
        }
      }
      while (x._3_1_ != '\0' && c + 2 < lx) {
        c = c + 2;
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c);
        iVar1 = v;
        if (*puVar5 == '\0') {
          if ((c + 1 < lx) &&
             (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c + 1),
             *puVar5 != '\0')) {
            if ((r + 1 < u) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + 1,c), iVar1 = v,
               *puVar5 != '\0')) {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *piVar7 = iVar1;
              if ((c + 1 < lx) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                 *puVar5 != '\0')) {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                uStack_234 = *puVar6;
                UFPC::MemMerge(k,uStack_234);
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + -1,c);
                if (*puVar5 != '\0') {
                  if ((c + 2 < lx) &&
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                     *puVar5 != '\0')) {
                    k = v;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                    uStack_234 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                    iVar1 = k;
                    y = *puVar6;
                    uVar4 = UFPC::MemMerge(uStack_234,y);
                    UFPC::MemMerge(iVar1,uVar4);
                  }
                  else {
                    k = v;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                    uStack_234 = *puVar6;
                    UFPC::MemMerge(k,uStack_234);
                  }
                }
              }
              if ((c + 2 < lx) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                 *puVar5 != '\0')) {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                uStack_234 = *puVar6;
                UFPC::MemMerge(k,uStack_234);
              }
            }
            else if ((c + 1 < lx) &&
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                    *puVar5 != '\0')) {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
              *piVar7 = iVar1;
              v = iVar1;
            }
            else {
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c)
              ;
              if (*puVar5 == '\0') {
                if ((c + 2 < lx) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                   *puVar5 != '\0')) {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
                  *piVar7 = iVar1;
                  v = iVar1;
                }
                else {
                  uVar4 = UFPC::MemNewLabel();
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
                  *puVar6 = uVar4;
                  v = uVar4;
                }
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
                *piVar7 = iVar1;
                v = iVar1;
                if ((c + 2 < lx) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                   *puVar5 != '\0')) {
                  k = v;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                  uStack_234 = *puVar6;
                  UFPC::MemMerge(k,uStack_234);
                }
              }
            }
            x._3_1_ = '\x01';
          }
          else if ((r + 1 < u) &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,r + 1,c), iVar1 = v,
                  *puVar5 != '\0')) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            if (((c + 1 < lx) && (r + 1 < u)) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1), *puVar5 != '\0')
               ) {
              x._3_1_ = '\x01';
            }
            else {
              x._3_1_ = '\0';
            }
          }
          else if (((c + 1 < lx) && (r + 1 < u)) &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1),
                  *puVar5 != '\0')) {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *puVar6 = uVar4;
            x._3_1_ = '\x01';
            v = uVar4;
          }
          else {
            x._3_1_ = '\0';
          }
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
          *piVar7 = iVar1;
          if ((c + 1 < lx) &&
             (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r,c + 1),
             *puVar5 != '\0')) {
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c);
            if (*puVar5 == '\0') {
              if ((c + 1 < lx) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                 *puVar5 != '\0')) {
                if ((c + -1 < 1) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1),
                   *puVar5 == '\0')) {
                  k = v;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                  uStack_234 = *puVar6;
                  UFPC::MemMerge(k,uStack_234);
                }
                else {
                  k = v;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
                  uStack_234 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                  iVar1 = k;
                  y = *puVar6;
                  uVar4 = UFPC::MemMerge(uStack_234,y);
                  UFPC::MemMerge(iVar1,uVar4);
                }
              }
              else if ((c + -1 < 1) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1),
                      *puVar5 == '\0')) {
                if ((c + 2 < lx) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                   *puVar5 != '\0')) {
                  k = v;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                  uStack_234 = *puVar6;
                  UFPC::MemMerge(k,uStack_234);
                }
              }
              else if ((c + 2 < lx) &&
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                      *puVar5 != '\0')) {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
                uStack_234 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
                iVar1 = k;
                y = *puVar6;
                uVar4 = UFPC::MemMerge(uStack_234,y);
                UFPC::MemMerge(iVar1,uVar4);
              }
              else {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
                uStack_234 = *puVar6;
                UFPC::MemMerge(k,uStack_234);
              }
            }
            else if ((c + 1 < lx) &&
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                    *puVar5 != '\0')) {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
            else if ((c + 2 < lx) &&
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e0,r + -1,c + 2),
                    *puVar5 != '\0')) {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              uStack_234 = *puVar6;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + 2);
              iVar1 = k;
              y = *puVar6;
              uVar4 = UFPC::MemMerge(uStack_234,y);
              UFPC::MemMerge(iVar1,uVar4);
            }
            else {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
            x._3_1_ = '\x01';
          }
          else {
            iVar1 = v;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,r,c);
            *piVar7 = iVar1;
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r + -1,c);
            if (*puVar5 == '\0') {
              if ((c + -1 < 1) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r + -1,c + -1),
                 *puVar5 == '\0')) {
                if ((c + 1 < lx) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                   *puVar5 != '\0')) {
                  k = v;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                  uStack_234 = *puVar6;
                  UFPC::MemMerge(k,uStack_234);
                }
              }
              else if ((c + 1 < lx) &&
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e0,r + -1,c + 1),
                      *puVar5 != '\0')) {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
                uStack_234 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
                iVar1 = k;
                y = *puVar6;
                uVar4 = UFPC::MemMerge(uStack_234,y);
                UFPC::MemMerge(iVar1,uVar4);
              }
              else {
                k = v;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c + -2);
                uStack_234 = *puVar6;
                UFPC::MemMerge(k,uStack_234);
              }
            }
            else {
              k = v;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r + -2,c);
              uStack_234 = *puVar6;
              UFPC::MemMerge(k,uStack_234);
            }
            if (((c + 1 < lx) && (r + 1 < u)) &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r + 1,c + 1), *puVar5 != '\0')
               ) {
              x._3_1_ = '\x01';
            }
            else {
              x._3_1_ = '\0';
            }
          }
        }
      }
    }
  }
  uVar4 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (iLabel = 0; iLabel < u; iLabel = iLabel + 2) {
    for (local_254 = 0; local_254 < lx; local_254 = local_254 + 2) {
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254);
      local_258 = *puVar6;
      if ((int)local_258 < 1) {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254);
        *piVar7 = 0;
        if (local_254 + 1 < lx) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254 + 1);
          *piVar7 = 0;
          if (iLabel + 1 < u) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254);
            *piVar7 = 0;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254 + 1);
            *piVar7 = 0;
          }
        }
        else if (iLabel + 1 < u) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254);
          *piVar7 = 0;
        }
      }
      else {
        local_258 = UFPC::MemGetLabel(local_258);
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e0,iLabel,local_254);
        uVar4 = local_258;
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254);
          *piVar7 = 0;
        }
        else {
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254);
          *puVar6 = uVar4;
        }
        if (local_254 + 1 < lx) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e0,iLabel,local_254 + 1);
          uVar4 = local_258;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254 + 1);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,iLabel,local_254 + 1);
            *puVar6 = uVar4;
          }
          if (iLabel + 1 < u) {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,iLabel + 1,local_254);
            uVar4 = local_258;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,iLabel + 1,local_254);
              *puVar6 = uVar4;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,iLabel + 1,local_254 + 1);
            uVar4 = local_258;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254 + 1);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,iLabel + 1,local_254 + 1);
              *puVar6 = uVar4;
            }
          }
        }
        else if (iLabel + 1 < u) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e0,iLabel + 1,local_254);
          uVar4 = local_258;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,iLabel + 1,local_254);
            *puVar6 = uVar4;
          }
        }
      }
    }
  }
  local_278 = 0;
  std::allocator<unsigned_long>::allocator(&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_270,4,&local_278,&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
             &local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_270);
  std::allocator<unsigned_long>::~allocator(&local_279);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e0);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_218);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = UFPC::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2e0,(MemMat<int> *)local_218);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2e0);
  cv::Mat_<int>::~Mat_(&local_2e0);
  UFPC::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_218);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e0);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }